

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseRelationship(AsciiParser *this,Relationship *result)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  AsciiParser *this_00;
  Relationship *pRVar4;
  bool bVar5;
  char cVar6;
  long *plVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type *psVar10;
  uint __val;
  int iVar11;
  anon_struct_8_0_00000001_for___align aVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint __len;
  char c;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> values;
  Path value;
  string err;
  Path base_prim_path;
  Path abs_path;
  ostringstream ss_e;
  char local_4b9;
  AsciiParser *local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4b0;
  undefined1 local_4a8 [40];
  undefined1 local_480 [24];
  undefined1 auStack_468 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0 [2];
  optional<tinyusdz::Path::PathType> local_3a8;
  undefined1 local_3a0 [40];
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  optional<tinyusdz::Path::PathType> local_2e0;
  undefined8 local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  undefined1 local_2c0;
  undefined4 local_2bc;
  undefined1 local_2b8;
  string local_2b0;
  Relationship *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  Path local_278;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  bVar5 = LookChar1(this,&local_4b9);
  if (bVar5) {
    local_4b8 = this;
    if (local_4b9 == '[') {
      local_4a8._0_8_ = (pointer)0x0;
      local_4a8._8_8_ = (pointer)0x0;
      local_4a8._16_8_ = (pointer)0x0;
      bVar5 = ParseBasicTypeArray<tinyusdz::Path>
                        (this,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4a8);
      if (bVar5) {
        local_290 = result;
        if (local_4a8._8_8_ != local_4a8._0_8_) {
          local_4b0 = &local_2f0;
          local_3a8 = (optional<tinyusdz::Path::PathType>)&local_2d0;
          local_288 = local_3d0;
          local_280 = local_3f0;
          lVar13 = 0;
          uVar15 = 0;
          do {
            GetCurrentPrimPath_abi_cxx11_(local_1a8,this);
            local_3a0._32_8_ = &local_370;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_3a0 + 0x20),"");
            Path::Path((Path *)local_480,local_1a8,(string *)(local_3a0 + 0x20));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._32_8_ != &local_370) {
              operator_delete((void *)local_3a0._32_8_,local_370._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              local_1a8[0].field_2._M_allocated_capacity + 1);
            }
            local_3a0._32_8_ = &local_370;
            local_378 = 0;
            local_370._M_allocated_capacity = local_370._M_allocated_capacity & 0xffffffffffffff00;
            local_360._M_p = (pointer)&local_350;
            local_358 = 0;
            local_350._M_local_buf[0] = '\0';
            local_340._M_p = (pointer)&local_330;
            local_338 = 0;
            local_330._M_local_buf[0] = '\0';
            local_320._M_p = (pointer)&local_310;
            local_318 = 0;
            local_310._M_local_buf[0] = '\0';
            local_300._M_p = (pointer)local_4b0;
            local_2f8 = 0;
            local_2f0._M_local_buf[0] = '\0';
            local_2e0 = local_3a8;
            local_2d8._0_1_ = false;
            local_2d8._1_7_ = 0;
            local_2d0._M_local_buf[0] = '\0';
            local_2c0 = 0;
            local_2bc = 0;
            local_2b8 = 0;
            args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            bVar5 = pathutil::ResolveRelativePath
                              ((Path *)local_480,
                               (Path *)((long)&(((string *)local_4a8._0_8_)->_M_dataplus)._M_p +
                                       lVar13),(Path *)(local_3a0 + 0x20),(string *)0x0);
            if (bVar5) {
              Path::operator=((Path *)((long)&(((string *)local_4a8._0_8_)->_M_dataplus)._M_p +
                                      lVar13),(Path *)(local_3a0 + 0x20));
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ParseRelationship",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0xdc9);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              local_3a0._0_8_ = local_3a0 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3a0,"Invalid relative Path: {}.","");
              Path::full_path_name_abi_cxx11_
                        (&local_2b0,
                         (Path *)((long)&(((string *)local_4a8._0_8_)->_M_dataplus)._M_p + lVar13));
              fmt::format<std::__cxx11::string>
                        (&local_278._prim_part,(fmt *)local_3a0,(string *)&local_2b0,args);
              poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_278._prim_part._M_dataplus._M_p,
                                  local_278._prim_part._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._prim_part._M_dataplus._M_p != &local_278._prim_part.field_2) {
                operator_delete(local_278._prim_part._M_dataplus._M_p,
                                CONCAT71(local_278._prim_part.field_2._M_allocated_capacity._1_7_,
                                         local_278._prim_part.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
                operator_delete((void *)local_3a0._0_8_,
                                CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1);
              }
              ::std::__cxx11::stringbuf::str();
              PushError(local_4b8,(string *)&local_278);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._prim_part._M_dataplus._M_p != &local_278._prim_part.field_2) {
                operator_delete(local_278._prim_part._M_dataplus._M_p,
                                CONCAT71(local_278._prim_part.field_2._M_allocated_capacity._1_7_,
                                         local_278._prim_part.field_2._M_local_buf[0]) + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
            }
            if (local_2e0 != local_3a8) {
              operator_delete((void *)local_2e0,
                              CONCAT71(local_2d0._M_allocated_capacity._1_7_,
                                       local_2d0._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_300._M_p != local_4b0) {
              operator_delete(local_300._M_p,
                              CONCAT71(local_2f0._M_allocated_capacity._1_7_,
                                       local_2f0._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_p != &local_310) {
              operator_delete(local_320._M_p,
                              CONCAT71(local_310._M_allocated_capacity._1_7_,
                                       local_310._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._M_p != &local_330) {
              operator_delete(local_340._M_p,
                              CONCAT71(local_330._M_allocated_capacity._1_7_,
                                       local_330._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_p != &local_350) {
              operator_delete(local_360._M_p,
                              CONCAT71(local_350._M_allocated_capacity._1_7_,
                                       local_350._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._32_8_ != &local_370) {
              operator_delete((void *)local_3a0._32_8_,local_370._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0[1]._0_8_ != local_288) {
              operator_delete((void *)local_3f0[1]._0_8_,
                              CONCAT71(local_3d0[0]._M_allocated_capacity._1_7_,
                                       local_3d0[0]._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_410[1]._0_8_ != local_280) {
              operator_delete((void *)local_410[1]._0_8_,
                              CONCAT71(local_3f0[0]._M_allocated_capacity._1_7_,
                                       local_3f0[0]._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430[1]._0_8_ != local_410) {
              operator_delete((void *)local_430[1]._0_8_,
                              CONCAT71(local_410[0]._M_allocated_capacity._1_7_,
                                       local_410[0]._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_450[1]._0_8_ != local_430) {
              operator_delete((void *)local_450[1]._0_8_,
                              CONCAT71(local_430[0]._M_allocated_capacity._1_7_,
                                       local_430[0]._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)auStack_468._8_8_ != local_450) {
              operator_delete((void *)auStack_468._8_8_,
                              CONCAT71(local_450[0]._M_allocated_capacity._1_7_,
                                       local_450[0]._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
              operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
            }
            if (!bVar5) goto LAB_0034bfbb;
            uVar15 = uVar15 + 1;
            lVar13 = lVar13 + 0xd0;
            this = local_4b8;
          } while (uVar15 < (ulong)(((long)(local_4a8._8_8_ - local_4a8._0_8_) >> 4) *
                                   0x4ec4ec4ec4ec4ec5));
        }
        pRVar4 = local_290;
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&local_290->targetPathVector,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4a8);
        pRVar4->type = PathVector;
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4a8);
LAB_0034c73d:
        bVar5 = SkipWhitespaceAndNewline(this,true);
        return bVar5;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ParseRelationship",0x11);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0xdbe);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failed to parse PathVector.",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_480);
      if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
        operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      ::std::ios_base::~ios_base(local_138);
LAB_0034bfbb:
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4a8);
    }
    else {
      if (local_4b9 == 'N') {
        local_480._0_8_ = local_480._0_8_ & 0xffffffffffffff00;
        memset(local_480 + 8,0,0xd0);
        bVar5 = ReadBasicType(this,(optional<tinyusdz::Path> *)local_480);
        if (bVar5) {
          if (local_480[0] != true) {
            result->type = ValueBlock;
            goto LAB_0034c73d;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseRelationship",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          iVar11 = 0xdda;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseRelationship",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          iVar11 = 0xdd5;
        }
        poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,iVar11);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to parse None.",0x15);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)(local_3a0 + 0x20));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._32_8_ != &local_370) {
          operator_delete((void *)local_3a0._32_8_,local_370._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
        if (local_480[0] != true) {
          return false;
        }
        if ((char *)local_3f0[1]._8_8_ != local_3d0[0]._M_local_buf + 8) {
          operator_delete((void *)local_3f0[1]._8_8_,local_3d0[0]._8_8_ + 1);
        }
        if ((char *)local_410[1]._8_8_ != local_3f0[0]._M_local_buf + 8) {
          operator_delete((void *)local_410[1]._8_8_,local_3f0[0]._8_8_ + 1);
        }
        if ((char *)local_430[1]._8_8_ != local_410[0]._M_local_buf + 8) {
          operator_delete((void *)local_430[1]._8_8_,local_410[0]._8_8_ + 1);
        }
        if ((char *)local_450[1]._8_8_ != local_430[0]._M_local_buf + 8) {
          operator_delete((void *)local_450[1]._8_8_,local_430[0]._8_8_ + 1);
        }
        if ((char *)auStack_468._16_8_ != local_450[0]._M_local_buf + 8) {
          operator_delete((void *)auStack_468._16_8_,local_450[0]._8_8_ + 1);
        }
        aVar12 = (anon_struct_8_0_00000001_for___align)local_480._8_8_;
        if ((undefined1 *)local_480._8_8_ == auStack_468) {
          return false;
        }
      }
      else {
        pcVar1 = local_480 + 0x10;
        local_480._0_8_ = pcVar1;
        if (local_4b9 != '<') {
          uVar14 = (uint)local_4b9;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ParseRelationship",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0xde1);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          __val = -uVar14;
          if (0 < (int)uVar14) {
            __val = uVar14;
          }
          __len = 1;
          if (9 < __val) {
            __len = 3 - (__val < 100);
          }
          paVar2 = &local_278._prim_part.field_2;
          local_278._prim_part._M_dataplus._M_p = (pointer)paVar2;
          ::std::__cxx11::string::_M_construct((ulong)&local_278,(char)__len - (local_4b9 >> 7));
          ::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_278._prim_part._M_dataplus._M_p + (uVar14 >> 0x1f),__len,__val);
          plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x3c9120)
          ;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 == paVar9) {
            local_370._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_370._8_8_ = plVar7[3];
            local_3a0._32_8_ = &local_370;
          }
          else {
            local_370._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_3a0._32_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar7;
          }
          local_378 = plVar7[1];
          *plVar7 = (long)paVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)::std::__cxx11::string::append(local_3a0 + 0x20);
          this_00 = local_4b8;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar10) {
            local_480._16_8_ = *psVar10;
            auStack_468._0_8_ = plVar7[3];
          }
          else {
            local_480._16_8_ = *psVar10;
            local_480._0_8_ = (size_type *)*plVar7;
          }
          local_480._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar7 + 1);
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_480._0_8_,local_480._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          if ((char *)local_480._0_8_ != pcVar1) {
            operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._32_8_ != &local_370) {
            operator_delete((void *)local_3a0._32_8_,local_370._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._prim_part._M_dataplus._M_p != paVar2) {
            operator_delete(local_278._prim_part._M_dataplus._M_p,
                            CONCAT71(local_278._prim_part.field_2._M_allocated_capacity._1_7_,
                                     local_278._prim_part.field_2._M_local_buf[0]) + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(this_00,(string *)local_480);
          if ((char *)local_480._0_8_ != pcVar1) {
            operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base(local_138);
          return false;
        }
        local_480._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_480._16_8_ = local_480._16_8_ & 0xffffffffffffff00;
        auStack_468._16_8_ = (char *)0x0;
        local_450[0]._M_local_buf[0] = '\0';
        local_450[1]._8_8_ = (char *)0x0;
        local_430[0]._M_local_buf[0] = '\0';
        local_430[1]._0_8_ = local_410;
        local_430[1]._8_8_ = (char *)0x0;
        local_410[0]._M_local_buf[0] = '\0';
        local_410[1]._8_8_ = (char *)0x0;
        local_3f0[0]._M_local_buf[0] = '\0';
        local_3f0[1]._8_8_ = (char *)0x0;
        local_3d0[0]._M_local_buf[0] = '\0';
        local_3d0[1]._0_1_ = false;
        local_3d0[1]._4_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
        local_3d0[1]._8_1_ = false;
        auStack_468._8_8_ = local_450;
        local_450[1]._0_8_ = local_430;
        local_410[1]._0_8_ = local_3f0;
        local_3f0[1]._0_8_ = local_3d0;
        bVar5 = ReadBasicType(this,(Path *)local_480);
        if (bVar5) {
          GetCurrentPrimPath_abi_cxx11_(local_1a8,this);
          paVar2 = &local_278._prim_part.field_2;
          local_278._prim_part._M_dataplus._M_p = (pointer)paVar2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
          Path::Path((Path *)(local_3a0 + 0x20),local_1a8,(string *)&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._prim_part._M_dataplus._M_p != paVar2) {
            operator_delete(local_278._prim_part._M_dataplus._M_p,
                            CONCAT71(local_278._prim_part.field_2._M_allocated_capacity._1_7_,
                                     local_278._prim_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          paVar9 = &local_278._prop_part.field_2;
          local_278._prim_part._M_string_length = 0;
          local_278._prim_part.field_2._M_local_buf[0] = '\0';
          local_278._prop_part._M_string_length = 0;
          local_278._prop_part.field_2._M_local_buf[0] = '\0';
          local_278._variant_part._M_dataplus._M_p = (pointer)&local_278._variant_part.field_2;
          local_278._variant_part._M_string_length = 0;
          local_278._variant_part.field_2._M_local_buf[0] = '\0';
          local_278._variant_selection_part._M_dataplus._M_p =
               (pointer)&local_278._variant_selection_part.field_2;
          local_278._variant_selection_part._M_string_length = 0;
          local_278._variant_selection_part.field_2._M_local_buf[0] = '\0';
          local_278._variant_part_str._M_dataplus._M_p =
               (pointer)&local_278._variant_part_str.field_2;
          local_278._variant_part_str._M_string_length = 0;
          local_278._variant_part_str.field_2._M_local_buf[0] = '\0';
          paVar3 = &local_278._element.field_2;
          local_278._element._M_string_length = 0;
          local_278._element.field_2._M_local_buf[0] = '\0';
          local_278._path_type.has_value_ = false;
          local_278._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_278._valid = false;
          local_3a0._0_8_ = local_3a0 + 0x10;
          local_3a0._8_8_ = 0;
          local_3a0[0x10] = '\0';
          local_278._prim_part._M_dataplus._M_p = (pointer)paVar2;
          local_278._prop_part._M_dataplus._M_p = (pointer)paVar9;
          local_278._element._M_dataplus._M_p = (pointer)paVar3;
          cVar6 = pathutil::ResolveRelativePath
                            ((Path *)(local_3a0 + 0x20),(Path *)local_480,&local_278,
                             (string *)local_3a0);
          if ((bool)cVar6) {
            Path::operator=(&result->targetPath,&local_278);
            result->type = Path;
          }
          else {
            local_4b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_4b0._1_7_,cVar6);
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ParseRelationship",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0xdb6);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_4a8._0_8_ = local_4a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4a8,"Invalid relative Path: {}. error = {}","");
            fmt::format<tinyusdz::Path,std::__cxx11::string>
                      (&local_2b0,(fmt *)local_4a8,(string *)local_480,(Path *)local_3a0,in_R8);
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2b0._M_dataplus._M_p,
                                local_2b0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer)local_4a8._0_8_ != (pointer)(local_4a8 + 0x10)) {
              operator_delete((void *)local_4a8._0_8_,
                              (ulong)((long)&(((string *)local_4a8._16_8_)->_M_dataplus)._M_p + 1));
            }
            ::std::__cxx11::stringbuf::str();
            PushError(local_4b8,&local_2b0);
            cVar6 = (char)local_4b0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
          }
          if ((undefined1 *)local_3a0._0_8_ != local_3a0 + 0x10) {
            operator_delete((void *)local_3a0._0_8_,CONCAT71(local_3a0._17_7_,local_3a0[0x10]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._element._M_dataplus._M_p != paVar3) {
            operator_delete(local_278._element._M_dataplus._M_p,
                            CONCAT71(local_278._element.field_2._M_allocated_capacity._1_7_,
                                     local_278._element.field_2._M_local_buf[0]) + 1);
          }
          this = local_4b8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._variant_part_str._M_dataplus._M_p !=
              &local_278._variant_part_str.field_2) {
            operator_delete(local_278._variant_part_str._M_dataplus._M_p,
                            CONCAT71(local_278._variant_part_str.field_2._M_allocated_capacity._1_7_
                                     ,local_278._variant_part_str.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._variant_selection_part._M_dataplus._M_p !=
              &local_278._variant_selection_part.field_2) {
            operator_delete(local_278._variant_selection_part._M_dataplus._M_p,
                            CONCAT71(local_278._variant_selection_part.field_2._M_allocated_capacity
                                     ._1_7_,local_278._variant_selection_part.field_2._M_local_buf
                                            [0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._variant_part._M_dataplus._M_p != &local_278._variant_part.field_2) {
            operator_delete(local_278._variant_part._M_dataplus._M_p,
                            CONCAT71(local_278._variant_part.field_2._M_allocated_capacity._1_7_,
                                     local_278._variant_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._prop_part._M_dataplus._M_p != paVar9) {
            operator_delete(local_278._prop_part._M_dataplus._M_p,
                            CONCAT71(local_278._prop_part.field_2._M_allocated_capacity._1_7_,
                                     local_278._prop_part.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._prim_part._M_dataplus._M_p != &local_278._prim_part.field_2) {
            operator_delete(local_278._prim_part._M_dataplus._M_p,
                            CONCAT71(local_278._prim_part.field_2._M_allocated_capacity._1_7_,
                                     local_278._prim_part.field_2._M_local_buf[0]) + 1);
          }
          if (local_2e0 != (optional<tinyusdz::Path::PathType>)&local_2d0) {
            operator_delete((void *)local_2e0,
                            CONCAT71(local_2d0._M_allocated_capacity._1_7_,local_2d0._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_300._M_p != &local_2f0) {
            operator_delete(local_300._M_p,
                            CONCAT71(local_2f0._M_allocated_capacity._1_7_,local_2f0._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_p != &local_310) {
            operator_delete(local_320._M_p,
                            CONCAT71(local_310._M_allocated_capacity._1_7_,local_310._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_p != &local_330) {
            operator_delete(local_340._M_p,
                            CONCAT71(local_330._M_allocated_capacity._1_7_,local_330._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_p != &local_350) {
            operator_delete(local_360._M_p,
                            CONCAT71(local_350._M_allocated_capacity._1_7_,local_350._M_local_buf[0]
                                    ) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._32_8_ != &local_370) {
            operator_delete((void *)local_3a0._32_8_,local_370._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0[1]._0_8_ != local_3d0) {
            operator_delete((void *)local_3f0[1]._0_8_,
                            CONCAT71(local_3d0[0]._M_allocated_capacity._1_7_,
                                     local_3d0[0]._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_410[1]._0_8_ != local_3f0) {
            operator_delete((void *)local_410[1]._0_8_,
                            CONCAT71(local_3f0[0]._M_allocated_capacity._1_7_,
                                     local_3f0[0]._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_430[1]._0_8_ != local_410) {
            operator_delete((void *)local_430[1]._0_8_,
                            CONCAT71(local_410[0]._M_allocated_capacity._1_7_,
                                     local_410[0]._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450[1]._0_8_ != local_430) {
            operator_delete((void *)local_450[1]._0_8_,
                            CONCAT71(local_430[0]._M_allocated_capacity._1_7_,
                                     local_430[0]._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auStack_468._8_8_ != local_450) {
            operator_delete((void *)auStack_468._8_8_,
                            CONCAT71(local_450[0]._M_allocated_capacity._1_7_,
                                     local_450[0]._M_local_buf[0]) + 1);
          }
          if ((undefined1 *)local_480._0_8_ != local_480 + 0x10) {
            operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
          }
          if (cVar6 == '\0') {
            return false;
          }
          goto LAB_0034c73d;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseRelationship",0x11);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar8 = (ostream *)::std::ostream::operator<<(local_1a8,0xdab);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to parse Path.",0x15);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)(local_3a0 + 0x20));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._32_8_ != &local_370) {
          operator_delete((void *)local_3a0._32_8_,local_370._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0[1]._0_8_ != local_3d0) {
          operator_delete((void *)local_3f0[1]._0_8_,
                          CONCAT71(local_3d0[0]._M_allocated_capacity._1_7_,
                                   local_3d0[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410[1]._0_8_ != local_3f0) {
          operator_delete((void *)local_410[1]._0_8_,
                          CONCAT71(local_3f0[0]._M_allocated_capacity._1_7_,
                                   local_3f0[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430[1]._0_8_ != local_410) {
          operator_delete((void *)local_430[1]._0_8_,
                          CONCAT71(local_410[0]._M_allocated_capacity._1_7_,
                                   local_410[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450[1]._0_8_ != local_430) {
          operator_delete((void *)local_450[1]._0_8_,
                          CONCAT71(local_430[0]._M_allocated_capacity._1_7_,
                                   local_430[0]._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_468._8_8_ != local_450) {
          operator_delete((void *)auStack_468._8_8_,
                          CONCAT71(local_450[0]._M_allocated_capacity._1_7_,
                                   local_450[0]._M_local_buf[0]) + 1);
        }
        auStack_468._0_8_ = local_480._16_8_;
        aVar12 = (anon_struct_8_0_00000001_for___align)local_480._0_8_;
        if ((undefined1 *)local_480._0_8_ == local_480 + 0x10) {
          return false;
        }
      }
      operator_delete((void *)aVar12,auStack_468._0_8_ + 1);
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseRelationship(Relationship *result) {
  char c;
  if (!LookChar1(&c)) {
    return false;
  }

  if (c == '<') {
    // Path
    Path value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse Path.");
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    Path base_prim_path(GetCurrentPrimPath(), "");
    Path abs_path;
    std::string err;
    if (!pathutil::ResolveRelativePath(base_prim_path, value, &abs_path,
                                       &err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Invalid relative Path: {}. error = {}", value, err));
    }

    result->set(abs_path);
  } else if (c == '[') {
    // PathVector
    std::vector<Path> values;
    if (!ParseBasicTypeArray(&values)) {
      PUSH_ERROR_AND_RETURN("Failed to parse PathVector.");
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    for (size_t i = 0; i < values.size(); i++) {
      Path base_prim_path(GetCurrentPrimPath(), "");
      Path abs_path;
      if (!pathutil::ResolveRelativePath(base_prim_path, values[i],
                                         &abs_path)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid relative Path: {}.",
                                          values[i].full_path_name()));
      }

      // replace
      values[i] = abs_path;
    }

    result->set(values);
  } else if (c == 'N') {
    // None
    nonstd::optional<Path> value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse None.");
    }

    // Should be empty for None.
    if (value.has_value()) {
      PUSH_ERROR_AND_RETURN("Failed to parse None.");
    }

    DCOUT("Relationship valueblock.");
    result->set_blocked();
  } else {
    PUSH_ERROR_AND_RETURN("Unexpected char \"" + std::to_string(c) +
                          "\" found. Expects Path or PathVector.");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  return true;
}